

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O3

void LU_forward_backward_solve(mod2sparse *L,mod2sparse *U,int *rows,int *cols,char *z,char *x)

{
  int iVar1;
  char *y;
  
  iVar1 = U->n_cols;
  y = (char *)chk_alloc(L->n_cols,1);
  if (0 < (long)iVar1) {
    memset(x,0,(long)iVar1);
  }
  mod2sparse_forward_sub(L,rows,z,y);
  mod2sparse_backward_sub(U,cols,y,x);
  free(y);
  return;
}

Assistant:

void LU_forward_backward_solve
        (mod2sparse *L,
         mod2sparse *U,
         int *rows,
         int *cols,
         char *z,
         char *x)
{
    int N,R;
    char *forward_b;
    N=mod2sparse_cols(U);
    R=mod2sparse_cols(L);
    forward_b=chk_alloc(R,sizeof(*forward_b));

    for(int bit_no=0;bit_no<N;bit_no++) x[bit_no]=0;

    mod2sparse_forward_sub
            ( L,	/* Matrix that is lower triangular after reordering */
              rows,		/* Array of indexes (from 0) of rows for new order */
              z,		/* Vector on right of equation, also reordered */
              forward_b		/* Place to store solution */
            );
    mod2sparse_backward_sub
            ( U,	/* Matrix that is lower triangular after reordering */
              cols,		/* Array of indexes (from 0) of cols for new order */
              forward_b,		/* Vector on right of equation, also reordered */
              x		/* Place to store solution */
            );
    free(forward_b);
}